

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void la_cross_call(TCGContext_conflict9 *s,int nt)

{
  uint uVar1;
  TCGTemp *ts_00;
  TCGRegSet *pTVar2;
  uint local_34;
  TCGRegSet set;
  TCGRegSet *pset;
  TCGTemp *ts;
  int i;
  TCGRegSet mask;
  int nt_local;
  TCGContext_conflict9 *s_local;
  
  uVar1 = s->tcg_target_call_clobber_regs ^ 0xffffffff;
  for (ts._4_4_ = 0; ts._4_4_ < nt; ts._4_4_ = ts._4_4_ + 1) {
    ts_00 = s->temps + ts._4_4_;
    if ((ts_00->state & 1) == 0) {
      pTVar2 = la_temp_pref(ts_00);
      local_34 = uVar1 & *pTVar2;
      if (local_34 == 0) {
        local_34 = s->tcg_target_available_regs[(uint)((ulong)*(undefined8 *)ts_00 >> 0x18) & 0xff]
                   & uVar1;
      }
      *pTVar2 = local_34;
    }
  }
  return;
}

Assistant:

static void la_cross_call(TCGContext *s, int nt)
{
    TCGRegSet mask = ~(s->tcg_target_call_clobber_regs);
    int i;

    for (i = 0; i < nt; i++) {
        TCGTemp *ts = &s->temps[i];
        if (!(ts->state & TS_DEAD)) {
            TCGRegSet *pset = la_temp_pref(ts);
            TCGRegSet set = *pset;

            set &= mask;
            /* If the combination is not possible, restart.  */
            if (set == 0) {
                set = s->tcg_target_available_regs[ts->type] & mask;
            }
            *pset = set;
        }
    }
}